

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O1

JSONWriter * __thiscall
hgdb::json::JSONWriter::value<std::basic_string_view<char,std::char_traits<char>>>
          (JSONWriter *this,basic_string_view<char,_std::char_traits<char>_> value)

{
  ostream *poVar1;
  char *in_RCX;
  string_view value_00;
  char local_51;
  string local_50;
  
  value_00._M_len = value._M_str;
  local_50._M_dataplus._M_p._0_1_ = 0x22;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->field_0x10,(char *)&local_50,1);
  value_00._M_str = in_RCX;
  escape_abi_cxx11_(&local_50,(JSONWriter *)value._M_len,value_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                              local_50._M_dataplus._M_p._0_1_),
                      local_50._M_string_length);
  local_51 = '\"';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_51,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_),
                    local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p._0_1_ = 0x2c;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->field_0x10,(char *)&local_50,1);
  return this;
}

Assistant:

JSONWriter &value(T value) {
        // if it's an array
        if constexpr (std::is_same_v<T, const char *> || std::is_same_v<T, std::string> ||
                      std::is_same_v<T, std::string_view>) {
            s_ << '"' << escape(value) << '"';
        } else if constexpr (std::is_same_v<T, bool>) {
            s_ << (value ? "true" : "false");
        } else {
            s_ << value;
        }
        s_ << ',';
        return *this;
    }